

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerWriteLargeSector(PgHdr *pPg)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  DbPage *pDVar9;
  long in_RDI;
  long in_FS_OFFSET;
  PgHdr *pPage_1;
  Pgno pg;
  Pgno nPagePerSector;
  Pager *pPager;
  int needSync;
  int ii;
  int nPage;
  Pgno pg1;
  Pgno nPageCount;
  int rc;
  PgHdr *pPage;
  u32 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  Pager *in_stack_ffffffffffffffb8;
  int local_2c;
  int local_28;
  int local_1c;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = 0;
  bVar4 = false;
  lVar3 = *(long *)(in_RDI + 0x28);
  iVar5 = (int)((long)(ulong)*(uint *)(lVar3 + 0xb8) / *(long *)(lVar3 + 200));
  *(byte *)(lVar3 + 0x19) = *(byte *)(lVar3 + 0x19) | 4;
  iVar6 = (*(int *)(in_RDI + 0x30) - 1U & (iVar5 - 1U ^ 0xffffffff)) + 1;
  uVar1 = *(uint *)(lVar3 + 0x20);
  if (uVar1 < *(uint *)(in_RDI + 0x30)) {
    local_28 = (*(int *)(in_RDI + 0x30) - iVar6) + 1;
  }
  else {
    local_28 = iVar5;
    if (uVar1 < (iVar6 + iVar5) - 1U) {
      local_28 = (uVar1 + 1) - iVar6;
    }
  }
  local_2c = 0;
  while( true ) {
    uVar1 = in_stack_ffffffffffffffb4 & 0xffffff;
    if (local_2c < local_28) {
      uVar1 = CONCAT13(local_1c == 0,(int3)in_stack_ffffffffffffffb4);
    }
    in_stack_ffffffffffffffb4 = uVar1;
    if ((char)(in_stack_ffffffffffffffb4 >> 0x18) == '\0') break;
    iVar7 = iVar6 + local_2c;
    if ((iVar7 == *(int *)(in_RDI + 0x30)) ||
       (iVar8 = sqlite3BitvecTest((Bitvec *)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                  in_stack_ffffffffffffffac), iVar8 == 0)) {
      if ((iVar7 != *(int *)(lVar3 + 0xc0)) &&
         (local_1c = sqlite3PagerGet((Pager *)CONCAT44(iVar5,iVar7),
                                     (Pgno)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                                     (DbPage **)
                                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                     in_stack_ffffffffffffffac), local_1c == 0)) {
        local_1c = pager_write((PgHdr *)in_stack_ffffffffffffffb8);
        if ((_DAT_aaaaaaaaaaaaaade & 8) != 0) {
          bVar4 = true;
        }
        sqlite3PagerUnrefNotNull((DbPage *)0x16b05d);
      }
    }
    else {
      pDVar9 = sqlite3PagerLookup(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
      if (pDVar9 != (DbPage *)0x0) {
        if ((pDVar9->flags & 8) != 0) {
          bVar4 = true;
        }
        sqlite3PagerUnrefNotNull((DbPage *)0x16b09d);
      }
    }
    local_2c = local_2c + 1;
  }
  if ((local_1c == 0) && (bVar4)) {
    for (local_2c = 0; local_2c < local_28; local_2c = local_2c + 1) {
      in_stack_ffffffffffffffb8 =
           (Pager *)sqlite3PagerLookup(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
      if (in_stack_ffffffffffffffb8 != (Pager *)0x0) {
        *(ushort *)&in_stack_ffffffffffffffb8->nRec =
             *(ushort *)&in_stack_ffffffffffffffb8->nRec | 8;
        sqlite3PagerUnrefNotNull((DbPage *)0x16b10a);
      }
    }
  }
  *(byte *)(lVar3 + 0x19) = *(byte *)(lVar3 + 0x19) & 0xfb;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_1c;
}

Assistant:

static SQLITE_NOINLINE int pagerWriteLargeSector(PgHdr *pPg){
  int rc = SQLITE_OK;          /* Return code */
  Pgno nPageCount;             /* Total number of pages in database file */
  Pgno pg1;                    /* First page of the sector pPg is located on. */
  int nPage = 0;               /* Number of pages starting at pg1 to journal */
  int ii;                      /* Loop counter */
  int needSync = 0;            /* True if any page has PGHDR_NEED_SYNC */
  Pager *pPager = pPg->pPager; /* The pager that owns pPg */
  Pgno nPagePerSector = (pPager->sectorSize/pPager->pageSize);

  /* Set the doNotSpill NOSYNC bit to 1. This is because we cannot allow
  ** a journal header to be written between the pages journaled by
  ** this function.
  */
  assert( !MEMDB );
  assert( (pPager->doNotSpill & SPILLFLAG_NOSYNC)==0 );
  pPager->doNotSpill |= SPILLFLAG_NOSYNC;

  /* This trick assumes that both the page-size and sector-size are
  ** an integer power of 2. It sets variable pg1 to the identifier
  ** of the first page of the sector pPg is located on.
  */
  pg1 = ((pPg->pgno-1) & ~(nPagePerSector-1)) + 1;

  nPageCount = pPager->dbSize;
  if( pPg->pgno>nPageCount ){
    nPage = (pPg->pgno - pg1)+1;
  }else if( (pg1+nPagePerSector-1)>nPageCount ){
    nPage = nPageCount+1-pg1;
  }else{
    nPage = nPagePerSector;
  }
  assert(nPage>0);
  assert(pg1<=pPg->pgno);
  assert((pg1+nPage)>pPg->pgno);

  for(ii=0; ii<nPage && rc==SQLITE_OK; ii++){
    Pgno pg = pg1+ii;
    PgHdr *pPage;
    if( pg==pPg->pgno || !sqlite3BitvecTest(pPager->pInJournal, pg) ){
      if( pg!=PAGER_SJ_PGNO(pPager) ){
        rc = sqlite3PagerGet(pPager, pg, &pPage, 0);
        if( rc==SQLITE_OK ){
          rc = pager_write(pPage);
          if( pPage->flags&PGHDR_NEED_SYNC ){
            needSync = 1;
          }
          sqlite3PagerUnrefNotNull(pPage);
        }
      }
    }else if( (pPage = sqlite3PagerLookup(pPager, pg))!=0 ){
      if( pPage->flags&PGHDR_NEED_SYNC ){
        needSync = 1;
      }
      sqlite3PagerUnrefNotNull(pPage);
    }
  }

  /* If the PGHDR_NEED_SYNC flag is set for any of the nPage pages
  ** starting at pg1, then it needs to be set for all of them. Because
  ** writing to any of these nPage pages may damage the others, the
  ** journal file must contain sync()ed copies of all of them
  ** before any of them can be written out to the database file.
  */
  if( rc==SQLITE_OK && needSync ){
    assert( !MEMDB );
    for(ii=0; ii<nPage; ii++){
      PgHdr *pPage = sqlite3PagerLookup(pPager, pg1+ii);
      if( pPage ){
        pPage->flags |= PGHDR_NEED_SYNC;
        sqlite3PagerUnrefNotNull(pPage);
      }
    }
  }

  assert( (pPager->doNotSpill & SPILLFLAG_NOSYNC)!=0 );
  pPager->doNotSpill &= ~SPILLFLAG_NOSYNC;
  return rc;
}